

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmanonfn.h
# Opt level: O1

int __thiscall CVmObjAnonFn::is_of_metaclass(CVmObjAnonFn *this,CVmMetaclass *meta)

{
  uint uVar1;
  
  uVar1 = 1;
  if ((metaclass_reg_ != meta) && (CVmObjVector::metaclass_reg_ != meta)) {
    uVar1 = (uint)(CVmObject::metaclass_reg_ == meta || CVmObjCollection::metaclass_reg_ == meta);
  }
  return uVar1;
}

Assistant:

virtual int is_of_metaclass(class CVmMetaclass *meta) const
    {
        /* try my own metaclass and my base class */
        return (meta == metaclass_reg_
                || CVmObjVector::is_of_metaclass(meta));
    }